

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hyperGraph.h
# Opt level: O0

double __thiscall
HyperGraph::effic_inf_valid_algo(HyperGraph *this,Nodelist *vecSeed,double delta,double eps)

{
  uint uVar1;
  value_type vVar2;
  bool bVar3;
  reference puVar4;
  reference pvVar5;
  const_reference pvVar6;
  size_type sVar7;
  size_t sVar8;
  const_reference pvVar9;
  int iVar10;
  double dVar11;
  undefined1 auVar12 [16];
  undefined4 uVar13;
  double dVar14;
  undefined4 uVar17;
  undefined1 auVar16 [16];
  reference rVar18;
  reference local_1e8;
  int local_1d4;
  undefined1 auStack_1d0 [4];
  int i;
  _Bit_type local_1c8;
  reference local_1c0;
  reference local_1b0;
  uint local_19c;
  size_t sStack_198;
  uint nbrId_1;
  size_t nextNbrIdx;
  _Bit_type local_188;
  reference local_180;
  double local_170;
  double randDouble;
  _Bit_type local_160;
  uint local_154;
  reference ppStack_150;
  uint nbrId;
  pair<unsigned_int,_float> *nbr;
  const_iterator __end4;
  const_iterator __begin4;
  value_type *__range4;
  undefined1 auStack_128 [4];
  value_type expand;
  _Bit_type local_120;
  reference local_118;
  value_type local_104;
  size_type sStack_100;
  uint32_t uStart;
  size_t currIdx;
  size_t numVisitNode;
  _Bit_type local_e8;
  uint local_dc;
  const_iterator cStack_d8;
  uint seed;
  const_iterator __end1;
  const_iterator __begin1;
  Nodelist *__range1;
  allocator<bool> local_a9;
  undefined1 local_a8 [8];
  vector<bool,_std::allocator<bool>_> vecBoolSeed;
  size_t numCoverd;
  size_t numHyperEdge;
  double LambdaL;
  double c;
  double eps_local;
  double delta_local;
  Nodelist *vecSeed_local;
  HyperGraph *this_local;
  uint64_t *psfmt64;
  uint32_t r;
  double *psfmt64_1;
  double r_1;
  undefined1 auVar15 [16];
  
  dVar11 = exp(1.0);
  dVar14 = (dVar11 - 2.0) + (dVar11 - 2.0);
  dVar11 = log(2.0 / delta);
  numCoverd = 0;
  vecBoolSeed.super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data.
  _M_end_of_storage = (_Bit_pointer)0x0;
  uVar1 = this->__numV;
  std::allocator<bool>::allocator(&local_a9);
  std::vector<bool,_std::allocator<bool>_>::vector
            ((vector<bool,_std::allocator<bool>_> *)local_a8,(ulong)uVar1,&local_a9);
  std::allocator<bool>::~allocator(&local_a9);
  __end1 = std::vector<unsigned_int,_std::allocator<unsigned_int>_>::begin(vecSeed);
  cStack_d8 = std::vector<unsigned_int,_std::allocator<unsigned_int>_>::end(vecSeed);
  while( true ) {
    bVar3 = __gnu_cxx::operator!=(&__end1,&stack0xffffffffffffff28);
    if (!bVar3) break;
    puVar4 = __gnu_cxx::
             __normal_iterator<const_unsigned_int_*,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>
             ::operator*(&__end1);
    local_dc = *puVar4;
    rVar18 = std::vector<bool,_std::allocator<bool>_>::operator[]
                       ((vector<bool,_std::allocator<bool>_> *)local_a8,(ulong)local_dc);
    local_e8 = rVar18._M_mask;
    numVisitNode = (size_t)rVar18._M_p;
    std::_Bit_reference::operator=((_Bit_reference *)&numVisitNode,true);
    __gnu_cxx::
    __normal_iterator<const_unsigned_int_*,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>
    ::operator++(&__end1);
  }
  do {
    while( true ) {
      uVar17 = (undefined4)
               ((ulong)vecBoolSeed.super__Bvector_base<std::allocator<bool>_>._M_impl.
                       super__Bvector_impl_data._M_end_of_storage >> 0x20);
      auVar15._8_4_ = uVar17;
      auVar15._0_8_ =
           vecBoolSeed.super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data.
           _M_end_of_storage;
      auVar15._12_4_ = 0x45300000;
      uVar13 = SUB84(vecBoolSeed.super__Bvector_base<std::allocator<bool>_>._M_impl.
                     super__Bvector_impl_data._M_end_of_storage,0);
      if (((dVar14 + dVar14) * (eps + 1.0) * dVar11) / (eps * eps) + 1.0 <=
          (auVar15._8_8_ - 1.9342813113834067e+25) +
          ((double)CONCAT44(0x43300000,uVar13) - 4503599627370496.0)) {
        auVar12._8_4_ = uVar17;
        auVar12._0_8_ =
             vecBoolSeed.super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data
             ._M_end_of_storage;
        auVar12._12_4_ = 0x45300000;
        uVar1 = this->__numV;
        auVar16._8_4_ = (int)(numCoverd >> 0x20);
        auVar16._0_8_ = numCoverd;
        auVar16._12_4_ = 0x45300000;
        std::vector<bool,_std::allocator<bool>_>::~vector
                  ((vector<bool,_std::allocator<bool>_> *)local_a8);
        return (((auVar12._8_8_ - 1.9342813113834067e+25) +
                ((double)CONCAT44(0x43300000,uVar13) - 4503599627370496.0)) * (double)uVar1) /
               ((auVar16._8_8_ - 1.9342813113834067e+25) +
               ((double)CONCAT44(0x43300000,(int)numCoverd) - 4503599627370496.0));
      }
      numCoverd = numCoverd + 1;
      currIdx = 0;
      sStack_100 = 0;
      uVar1 = this->__numV;
      if (0x17d < dsfmt_global_data.idx) {
        dsfmt_gen_rand_all(&dsfmt_global_data);
        dsfmt_global_data.idx = 0;
      }
      local_104 = (uint)dsfmt_global_data.status[0].u[dsfmt_global_data.idx] % uVar1;
      dsfmt_global_data.idx = dsfmt_global_data.idx + 1;
      rVar18 = std::vector<bool,_std::allocator<bool>_>::operator[]
                         ((vector<bool,_std::allocator<bool>_> *)local_a8,(ulong)local_104);
      local_118 = rVar18;
      bVar3 = std::_Bit_reference::operator_cast_to_bool(&local_118);
      sVar8 = currIdx;
      vVar2 = local_104;
      if (!bVar3) break;
      vecBoolSeed.super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data.
      _M_end_of_storage =
           (_Bit_pointer)
           ((long)vecBoolSeed.super__Bvector_base<std::allocator<bool>_>._M_impl.
                  super__Bvector_impl_data._M_end_of_storage + 1);
    }
    currIdx = currIdx + 1;
    pvVar5 = std::vector<unsigned_int,_std::allocator<unsigned_int>_>::operator[]
                       (&this->__vecVisitNode,sVar8);
    *pvVar5 = vVar2;
    rVar18 = std::vector<bool,_std::allocator<bool>_>::operator[]
                       (&this->__vecVisitBool,(ulong)local_104);
    _auStack_128 = rVar18;
    std::_Bit_reference::operator=((_Bit_reference *)auStack_128,true);
    while (sVar7 = sStack_100, sStack_100 < currIdx) {
      sStack_100 = sStack_100 + 1;
      pvVar5 = std::vector<unsigned_int,_std::allocator<unsigned_int>_>::operator[]
                         (&this->__vecVisitNode,sVar7);
      uVar1 = *pvVar5;
      if (this->_cascadeModel == IC) {
        pvVar6 = std::
                 vector<std::vector<std::pair<unsigned_int,_float>,_std::allocator<std::pair<unsigned_int,_float>_>_>,_std::allocator<std::vector<std::pair<unsigned_int,_float>,_std::allocator<std::pair<unsigned_int,_float>_>_>_>_>
                 ::operator[](this->_graph,(ulong)uVar1);
        __end4 = std::
                 vector<std::pair<unsigned_int,_float>,_std::allocator<std::pair<unsigned_int,_float>_>_>
                 ::begin(pvVar6);
        nbr = (pair<unsigned_int,_float> *)
              std::
              vector<std::pair<unsigned_int,_float>,_std::allocator<std::pair<unsigned_int,_float>_>_>
              ::end(pvVar6);
        while( true ) {
          bVar3 = __gnu_cxx::operator!=
                            (&__end4,(__normal_iterator<const_std::pair<unsigned_int,_float>_*,_std::vector<std::pair<unsigned_int,_float>,_std::allocator<std::pair<unsigned_int,_float>_>_>_>
                                      *)&nbr);
          if (!bVar3) break;
          ppStack_150 = __gnu_cxx::
                        __normal_iterator<const_std::pair<unsigned_int,_float>_*,_std::vector<std::pair<unsigned_int,_float>,_std::allocator<std::pair<unsigned_int,_float>_>_>_>
                        ::operator*(&__end4);
          local_154 = ppStack_150->first;
          rVar18 = std::vector<bool,_std::allocator<bool>_>::operator[]
                             (&this->__vecVisitBool,(ulong)local_154);
          local_160 = rVar18._M_mask;
          randDouble = (double)rVar18._M_p;
          bVar3 = std::_Bit_reference::operator_cast_to_bool((_Bit_reference *)&randDouble);
          if (!bVar3) {
            if (0x17d < dsfmt_global_data.idx) {
              dsfmt_gen_rand_all(&dsfmt_global_data);
              dsfmt_global_data.idx = 0;
            }
            iVar10 = dsfmt_global_data.idx + 1;
            local_170 = 2.0 - dsfmt_global_data.status[0].d[dsfmt_global_data.idx];
            dsfmt_global_data.idx = iVar10;
            if (local_170 <= (double)ppStack_150->second) {
              rVar18 = std::vector<bool,_std::allocator<bool>_>::operator[]
                                 ((vector<bool,_std::allocator<bool>_> *)local_a8,(ulong)local_154);
              local_180 = rVar18;
              bVar3 = std::_Bit_reference::operator_cast_to_bool(&local_180);
              sVar8 = currIdx;
              uVar1 = local_154;
              if (bVar3) {
                vecBoolSeed.super__Bvector_base<std::allocator<bool>_>._M_impl.
                super__Bvector_impl_data._M_end_of_storage =
                     (_Bit_pointer)
                     ((long)vecBoolSeed.super__Bvector_base<std::allocator<bool>_>._M_impl.
                            super__Bvector_impl_data._M_end_of_storage + 1);
                goto LAB_00123516;
              }
              currIdx = currIdx + 1;
              pvVar5 = std::vector<unsigned_int,_std::allocator<unsigned_int>_>::operator[]
                                 (&this->__vecVisitNode,sVar8);
              *pvVar5 = uVar1;
              rVar18 = std::vector<bool,_std::allocator<bool>_>::operator[]
                                 (&this->__vecVisitBool,(ulong)local_154);
              local_188 = rVar18._M_mask;
              nextNbrIdx = (size_t)rVar18._M_p;
              std::_Bit_reference::operator=((_Bit_reference *)&nextNbrIdx,true);
            }
          }
          __gnu_cxx::
          __normal_iterator<const_std::pair<unsigned_int,_float>_*,_std::vector<std::pair<unsigned_int,_float>,_std::allocator<std::pair<unsigned_int,_float>_>_>_>
          ::operator++(&__end4);
        }
      }
      else if (this->_cascadeModel == LT) {
        pvVar6 = std::
                 vector<std::vector<std::pair<unsigned_int,_float>,_std::allocator<std::pair<unsigned_int,_float>_>_>,_std::allocator<std::vector<std::pair<unsigned_int,_float>,_std::allocator<std::pair<unsigned_int,_float>_>_>_>_>
                 ::operator[](this->_graph,(ulong)uVar1);
        sVar7 = std::
                vector<std::pair<unsigned_int,_float>,_std::allocator<std::pair<unsigned_int,_float>_>_>
                ::size(pvVar6);
        if (sVar7 != 0) {
          pvVar6 = std::
                   vector<std::vector<std::pair<unsigned_int,_float>,_std::allocator<std::pair<unsigned_int,_float>_>_>,_std::allocator<std::vector<std::pair<unsigned_int,_float>,_std::allocator<std::pair<unsigned_int,_float>_>_>_>_>
                   ::operator[](this->_graph,(ulong)uVar1);
          sVar8 = gen_random_node_by_weight_LT(pvVar6);
          sStack_198 = sVar8;
          pvVar6 = std::
                   vector<std::vector<std::pair<unsigned_int,_float>,_std::allocator<std::pair<unsigned_int,_float>_>_>,_std::allocator<std::vector<std::pair<unsigned_int,_float>,_std::allocator<std::pair<unsigned_int,_float>_>_>_>_>
                   ::operator[](this->_graph,(ulong)uVar1);
          sVar7 = std::
                  vector<std::pair<unsigned_int,_float>,_std::allocator<std::pair<unsigned_int,_float>_>_>
                  ::size(pvVar6);
          if (sVar7 <= sVar8) break;
          pvVar6 = std::
                   vector<std::vector<std::pair<unsigned_int,_float>,_std::allocator<std::pair<unsigned_int,_float>_>_>,_std::allocator<std::vector<std::pair<unsigned_int,_float>,_std::allocator<std::pair<unsigned_int,_float>_>_>_>_>
                   ::operator[](this->_graph,(ulong)uVar1);
          pvVar9 = std::
                   vector<std::pair<unsigned_int,_float>,_std::allocator<std::pair<unsigned_int,_float>_>_>
                   ::operator[](pvVar6,sStack_198);
          local_19c = pvVar9->first;
          rVar18 = std::vector<bool,_std::allocator<bool>_>::operator[]
                             (&this->__vecVisitBool,(ulong)local_19c);
          local_1b0 = rVar18;
          bVar3 = std::_Bit_reference::operator_cast_to_bool(&local_1b0);
          if (bVar3) break;
          rVar18 = std::vector<bool,_std::allocator<bool>_>::operator[]
                             ((vector<bool,_std::allocator<bool>_> *)local_a8,(ulong)local_19c);
          local_1c0 = rVar18;
          bVar3 = std::_Bit_reference::operator_cast_to_bool(&local_1c0);
          sVar8 = currIdx;
          uVar1 = local_19c;
          if (bVar3) {
            vecBoolSeed.super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data.
            _M_end_of_storage =
                 (_Bit_pointer)
                 ((long)vecBoolSeed.super__Bvector_base<std::allocator<bool>_>._M_impl.
                        super__Bvector_impl_data._M_end_of_storage + 1);
            break;
          }
          currIdx = currIdx + 1;
          pvVar5 = std::vector<unsigned_int,_std::allocator<unsigned_int>_>::operator[]
                             (&this->__vecVisitNode,sVar8);
          *pvVar5 = uVar1;
          rVar18 = std::vector<bool,_std::allocator<bool>_>::operator[]
                             (&this->__vecVisitBool,(ulong)local_19c);
          _auStack_1d0 = rVar18;
          std::_Bit_reference::operator=((_Bit_reference *)auStack_1d0,true);
        }
      }
    }
LAB_00123516:
    for (local_1d4 = 0; (ulong)(long)local_1d4 < currIdx; local_1d4 = local_1d4 + 1) {
      pvVar5 = std::vector<unsigned_int,_std::allocator<unsigned_int>_>::operator[]
                         (&this->__vecVisitNode,(long)local_1d4);
      rVar18 = std::vector<bool,_std::allocator<bool>_>::operator[]
                         (&this->__vecVisitBool,(ulong)*pvVar5);
      local_1e8 = rVar18;
      std::_Bit_reference::operator=(&local_1e8,false);
    }
  } while( true );
}

Assistant:

double effic_inf_valid_algo(const Nodelist& vecSeed, const double delta = 1e-3, const double eps = 0.01)
    {
        const double c = 2.0 * (exp(1.0) - 2.0);
        const double LambdaL = 1.0 + 2.0 * c * (1.0 + eps) * log(2.0 / delta) / (eps * eps);
        size_t numHyperEdge = 0;
        size_t numCoverd = 0;
        std::vector<bool> vecBoolSeed(__numV);
        for (auto seed : vecSeed) vecBoolSeed[seed] = true;

        while (numCoverd < LambdaL)
        {
            numHyperEdge++;
            size_t numVisitNode = 0, currIdx = 0;
            const auto uStart = dsfmt_gv_genrand_uint32_range(__numV);
            if (vecBoolSeed[uStart])
            {
                // Stop, this sample is covered
                numCoverd++;
                continue;
            }
            __vecVisitNode[numVisitNode++] = uStart;
            __vecVisitBool[uStart] = true;
            while (currIdx < numVisitNode)
            {
                const auto expand = __vecVisitNode[currIdx++];
                if (_cascadeModel == IC)
                {
                    for (auto& nbr : _graph[expand])
                    {
                        const auto nbrId = nbr.first;
                        if (__vecVisitBool[nbrId])
                            continue;
                        const auto randDouble = dsfmt_gv_genrand_open_close();
                        if (randDouble > nbr.second)
                            continue;
                        if (vecBoolSeed[nbrId])
                        {
                            // Stop, this sample is covered
                            numCoverd++;
                            goto postProcess;
                        }
                        __vecVisitNode[numVisitNode++] = nbrId;
                        __vecVisitBool[nbrId] = true;
                    }
                }
                else if (_cascadeModel == LT)
                {
                    if (_graph[expand].size() == 0)
                        continue;
                    const auto nextNbrIdx = gen_random_node_by_weight_LT(_graph[expand]);
                    if (nextNbrIdx >= _graph[expand].size()) break; // No element activated
                    const auto nbrId = _graph[expand][nextNbrIdx].first;
                    if (__vecVisitBool[nbrId]) break; // Stop, no further node activated
                    if (vecBoolSeed[nbrId])
                    {
                        // Stop, this sample is covered
                        numCoverd++;
                        goto postProcess;
                    }
                    __vecVisitNode[numVisitNode++] = nbrId;
                    __vecVisitBool[nbrId] = true;
                }
            }
            postProcess:
            for (auto i = 0; i < numVisitNode; i++)
                __vecVisitBool[__vecVisitNode[i]] = false;
        }
        return 1.0 * numCoverd * __numV / numHyperEdge;
    }